

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  int iVar1;
  bool bVar2;
  uchar *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  do {
    bVar2 = vector<unsigned_char>::try_push_back
                      ((vector<unsigned_char> *)
                       CONCAT17((char)((uint)*(undefined4 *)(in_RDI + 0x7c) >> 0x18),
                                in_stack_ffffffffffffffe8),in_RDI);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      return false;
    }
    *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + 8;
    *(int *)(in_RDI + 0x7c) = *(int *)(in_RDI + 0x7c) << 8;
    iVar1 = *(int *)(in_RDI + 0x84);
    *(int *)(in_RDI + 0x84) = iVar1 << 8;
  } while ((uint)(iVar1 << 8) < 0x1000000);
  return true;
}

Assistant:

bool symbol_codec::arith_renorm_enc_interval()
   {
      do
      {
         if (!m_arith_output_buf.try_push_back( (m_arith_base >> 24) & 0xFF ))
            return false;
         m_total_bits_written += 8;

         m_arith_base <<= 8;
      } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
      return true;
   }